

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseBox(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkBox)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pAVar12;
  Abc_Ntk_t *pAVar13;
  void *pvVar14;
  char *pcVar15;
  size_t sVar16;
  Vec_Ptr_t *pVVar17;
  Ver_Stream_t *pVVar18;
  long lVar19;
  char *pcVar20;
  char *__s;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  Abc_Ntk_t *pNtk_00;
  int nLsb;
  int nMsb;
  uint Value;
  char Buffer [1000];
  uint local_464;
  uint local_460;
  char local_459;
  Abc_Ntk_t *local_458;
  char *local_450;
  Ver_Stream_t *local_448;
  Abc_Ntk_t *local_440;
  Abc_Obj_t *local_438;
  Abc_Obj_t *local_430;
  Ver_Man_t *local_428;
  uint local_41c;
  char local_418 [1000];
  
  pVVar18 = pMan->pReader;
  pcVar9 = Ver_ParseGetName(pMan);
  if (pcVar9 == (char *)0x0) {
    return 0;
  }
  local_458 = pNtk;
  pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BLACKBOX);
  (pAVar10->field_5).pData = pNtkBox;
  Abc_ObjAssignName(pAVar10,pcVar9,(char *)0x0);
  cVar4 = Ver_StreamPopChar(pVVar18);
  if (cVar4 == '(') {
    local_448 = pVVar18;
    Ver_ParseSkipComments(pMan);
    pAVar11 = (Abc_Obj_t *)malloc(0x10);
    pAVar11->pNtk = (Abc_Ntk_t *)0x10;
    pAVar12 = (Abc_Obj_t *)malloc(0x80);
    pAVar11->pNext = pAVar12;
    (pAVar10->field_6).pCopy = pAVar11;
    local_438 = pAVar11;
    local_430 = pAVar10;
    local_428 = pMan;
    do {
      pAVar13 = (Abc_Ntk_t *)malloc(0x10);
      pAVar13->ntkType = ABC_NTK_NONE;
      pAVar13->ntkFunc = ABC_FUNC_NONE;
      pcVar9 = (char *)malloc(0x10);
      pcVar9[0] = '\b';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      pcVar9[4] = '\0';
      pcVar9[5] = '\0';
      pcVar9[6] = '\0';
      pcVar9[7] = '\0';
      pvVar14 = malloc(0x40);
      pNtk_00 = local_458;
      *(void **)(pcVar9 + 8) = pvVar14;
      pAVar13->pName = pcVar9;
      uVar22 = *(uint *)((long)&pAVar11->pNtk + 4);
      local_440 = pAVar13;
      if (uVar22 == *(uint *)&pAVar11->pNtk) {
        if ((int)uVar22 < 0x10) {
          if (pAVar11->pNext == (Abc_Obj_t *)0x0) {
            pAVar12 = (Abc_Obj_t *)malloc(0x80);
          }
          else {
            pAVar12 = (Abc_Obj_t *)realloc(pAVar11->pNext,0x80);
          }
          pAVar11->pNext = pAVar12;
          *(undefined4 *)&pAVar11->pNtk = 0x10;
        }
        else {
          if (pAVar11->pNext == (Abc_Obj_t *)0x0) {
            pAVar12 = (Abc_Obj_t *)malloc((ulong)uVar22 << 4);
          }
          else {
            pAVar12 = (Abc_Obj_t *)realloc(pAVar11->pNext,(ulong)uVar22 << 4);
          }
          pAVar11->pNext = pAVar12;
          *(uint *)&pAVar11->pNtk = uVar22 * 2;
        }
      }
      else {
        pAVar12 = pAVar11->pNext;
      }
      pVVar18 = local_448;
      iVar6 = *(int *)((long)&pAVar11->pNtk + 4);
      *(int *)((long)&pAVar11->pNtk + 4) = iVar6 + 1;
      (&pAVar12->pNtk)[iVar6] = local_440;
      cVar4 = Ver_StreamScanChar(local_448);
      if (cVar4 == '.') {
        cVar5 = Ver_StreamPopChar(pVVar18);
        if (cVar5 != '.') {
          pcVar9 = Abc_ObjName(pAVar10);
          pcVar15 = "Cannot parse box %s (expected .).";
          goto LAB_0035636f;
        }
        pcVar9 = Ver_ParseGetName(pMan);
        if (pcVar9 == (char *)0x0) {
          return 0;
        }
        pcVar15 = Extra_UtilStrsav(pcVar9);
        *(char **)local_440 = pcVar15;
        cVar5 = Ver_StreamPopChar(pVVar18);
        if (cVar5 != '(') {
          pcVar15 = Abc_ObjName(pAVar10);
          pcVar20 = "Cannot formal parameter %s of box %s (expected opening parenthesis).";
LAB_0035638b:
          __s = pMan->sError;
          goto LAB_003563b5;
        }
        Ver_ParseSkipComments(pMan);
        pNtk_00 = local_458;
      }
      cVar5 = Ver_StreamScanChar(pVVar18);
      if (cVar5 == '{') {
        Ver_StreamPopChar(pVVar18);
        do {
          Ver_ParseSkipComments(pMan);
          pcVar9 = Ver_ParseGetName(pMan);
          if (pcVar9 == (char *)0x0) {
            return 0;
          }
          sVar16 = strlen(pcVar9);
          cVar5 = pcVar9[sVar16 - 1];
          if (cVar5 == '}') {
            pcVar9[sVar16 - 1] = '\0';
          }
          pAVar11 = local_438;
          local_450 = pcVar9;
          if (*pcVar9 == '\0') goto LAB_00356212;
          local_459 = cVar5;
          if ((byte)(*pcVar9 - 0x31U) < 9) {
            iVar6 = Ver_ParseConstant(pMan,pcVar9);
            if (iVar6 == 0) {
              return 0;
            }
            pVVar17 = pMan->vNames;
            if (0 < pVVar17->nSize) {
              lVar19 = 0;
              do {
                sprintf(local_418,"1\'b%d",(ulong)(pVVar17->pArray[lVar19] != (void *)0x0));
                pAVar10 = Ver_ParseFindNet(pNtk_00,local_418);
                pMan = local_428;
                if (pAVar10 == (Abc_Obj_t *)0x0) {
                  pcVar15 = Abc_ObjName(local_430);
                  pcVar20 = "Actual net \"%s\" is missing in gate \"%s\".";
                  pcVar9 = local_418;
                  goto LAB_003562d0;
                }
                puVar2 = (uint *)local_440->pName;
                uVar22 = puVar2[1];
                if (uVar22 == *puVar2) {
                  if ((int)uVar22 < 0x10) {
                    if (*(void **)(puVar2 + 2) == (void *)0x0) {
                      pvVar14 = malloc(0x80);
                    }
                    else {
                      pvVar14 = realloc(*(void **)(puVar2 + 2),0x80);
                    }
                    *(void **)(puVar2 + 2) = pvVar14;
                    *puVar2 = 0x10;
                  }
                  else {
                    if (*(void **)(puVar2 + 2) == (void *)0x0) {
                      pvVar14 = malloc((ulong)uVar22 << 4);
                    }
                    else {
                      pvVar14 = realloc(*(void **)(puVar2 + 2),(ulong)uVar22 << 4);
                    }
                    *(void **)(puVar2 + 2) = pvVar14;
                    *puVar2 = uVar22 * 2;
                  }
                }
                else {
                  pvVar14 = *(void **)(puVar2 + 2);
                }
                uVar22 = puVar2[1];
                puVar2[1] = uVar22 + 1;
                *(Abc_Obj_t **)((long)pvVar14 + (long)(int)uVar22 * 8) = pAVar10;
                lVar19 = lVar19 + 1;
                pVVar17 = local_428->vNames;
              } while (lVar19 < pVVar17->nSize);
            }
          }
          else {
            sVar16 = strlen(pcVar9);
            if ((pcVar9[sVar16 - 1] == ']') && (pMan->fNameLast == 0)) {
              Ver_ParseSignalSuffix(pMan,pcVar9,(int *)&local_460,(int *)&local_464);
              uVar23 = (ulong)local_460;
              uVar22 = local_464;
            }
            else {
              local_464 = 0xffffffff;
              local_460 = 0xffffffff;
              uVar22 = 0xffffffff;
              if (pMan->tName2Suffix == (st__table *)0x0) {
                uVar23 = 0xffffffff;
              }
              else {
                iVar6 = st__lookup(pMan->tName2Suffix,pcVar9,(char **)&local_41c);
                uVar23 = 0xffffffff;
                if (iVar6 != 0) {
                  local_460 = local_41c >> 8 & 0xff;
                  uVar23 = (ulong)local_460;
                  local_464 = local_41c & 0xff;
                  uVar22 = local_464;
                }
              }
            }
            uVar21 = (uint)uVar23;
            if ((uVar21 & uVar22) == 0xffffffff) {
              pAVar11 = Ver_ParseFindNet(pNtk_00,pcVar9);
              pAVar10 = local_430;
              if (pAVar11 == (Abc_Obj_t *)0x0) {
                iVar6 = strncmp(pcVar9,"Open_",5);
                if ((iVar6 != 0) && (iVar6 = strncmp(pcVar9,"dct_unconnected",0xf), iVar6 != 0)) {
                  pcVar15 = Abc_ObjName(pAVar10);
                  pcVar20 = "Actual net \"%s\" is missing in box \"%s\".";
                  goto LAB_0035638b;
                }
                pAVar11 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NET);
              }
              puVar2 = (uint *)local_440->pName;
              uVar22 = puVar2[1];
              if (uVar22 == *puVar2) {
                if ((int)uVar22 < 0x10) {
                  if (*(void **)(puVar2 + 2) == (void *)0x0) {
                    pvVar14 = malloc(0x80);
                  }
                  else {
                    pvVar14 = realloc(*(void **)(puVar2 + 2),0x80);
                  }
                  *(void **)(puVar2 + 2) = pvVar14;
                  *puVar2 = 0x10;
                }
                else {
                  if (*(void **)(puVar2 + 2) == (void *)0x0) {
                    pvVar14 = malloc((ulong)uVar22 << 4);
                  }
                  else {
                    pvVar14 = realloc(*(void **)(puVar2 + 2),(ulong)uVar22 << 4);
                  }
                  *(void **)(puVar2 + 2) = pvVar14;
                  *puVar2 = uVar22 * 2;
                }
              }
              else {
                pvVar14 = *(void **)(puVar2 + 2);
              }
              uVar22 = puVar2[1];
              puVar2[1] = uVar22 + 1;
              *(Abc_Obj_t **)((long)pvVar14 + (long)(int)uVar22 * 8) = pAVar11;
            }
            else {
              if (((int)uVar21 < 0) || ((int)uVar22 < 0)) {
                __assert_fail("nMsb >= 0 && nLsb >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verCore.c"
                              ,0x75e,"int Ver_ParseBox(Ver_Man_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
              }
              iVar6 = uVar22 - uVar21;
              if (uVar22 < uVar21) {
                iVar6 = -(uVar22 - uVar21);
              }
              if (-1 < iVar6) {
                iVar6 = iVar6 + 1;
                do {
                  sprintf(local_418,"%s[%d]",local_450,uVar23);
                  pAVar10 = Ver_ParseFindNet(pNtk_00,local_418);
                  pcVar9 = local_450;
                  if (pAVar10 == (Abc_Obj_t *)0x0) {
                    iVar7 = strncmp(local_450,"Open_",5);
                    if ((iVar7 != 0) && (iVar7 = strncmp(pcVar9,"dct_unconnected",0xf), iVar7 != 0))
                    goto LAB_003562aa;
                    pAVar10 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NET);
                  }
                  puVar2 = (uint *)local_440->pName;
                  uVar1 = puVar2[1];
                  if (uVar1 == *puVar2) {
                    if ((int)uVar1 < 0x10) {
                      if (*(void **)(puVar2 + 2) == (void *)0x0) {
                        pvVar14 = malloc(0x80);
                      }
                      else {
                        pvVar14 = realloc(*(void **)(puVar2 + 2),0x80);
                      }
                      *(void **)(puVar2 + 2) = pvVar14;
                      *puVar2 = 0x10;
                    }
                    else {
                      if (*(void **)(puVar2 + 2) == (void *)0x0) {
                        pvVar14 = malloc((ulong)uVar1 << 4);
                      }
                      else {
                        pvVar14 = realloc(*(void **)(puVar2 + 2),(ulong)uVar1 << 4);
                      }
                      *(void **)(puVar2 + 2) = pvVar14;
                      *puVar2 = uVar1 * 2;
                    }
                  }
                  else {
                    pvVar14 = *(void **)(puVar2 + 2);
                  }
                  uVar1 = puVar2[1];
                  puVar2[1] = uVar1 + 1;
                  *(Abc_Obj_t **)((long)pvVar14 + (long)(int)uVar1 * 8) = pAVar10;
                  uVar23 = (ulong)((int)uVar23 + (-(uint)(uVar22 < uVar21) | 1));
                  iVar6 = iVar6 + -1;
                  pNtk_00 = local_458;
                } while (0 < iVar6);
              }
            }
          }
          pMan = local_428;
          pVVar18 = local_448;
          pAVar10 = local_430;
          pAVar11 = local_438;
          if (local_459 == '}') goto LAB_00356212;
          Ver_ParseSkipComments(local_428);
          pVVar18 = local_448;
          cVar5 = Ver_StreamPopChar(local_448);
          pAVar10 = local_430;
        } while (cVar5 == ',');
        pAVar11 = local_438;
        if (cVar5 != '}') {
          __s = pMan->sError;
          pcVar15 = Abc_ObjName(local_430);
          pcVar20 = "Cannot parse formal parameter %s of gate %s (expected comma).";
          pcVar9 = local_450;
          goto LAB_003563b5;
        }
      }
      else {
        pcVar9 = Ver_ParseGetName(pMan);
        if (pcVar9 == (char *)0x0) {
          return 0;
        }
        local_450 = pcVar9;
        if (*pcVar9 == '\0') {
          pAVar11 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NET);
        }
        else {
          pAVar11 = Ver_ParseFindNet(pNtk_00,pcVar9);
          if (pAVar11 == (Abc_Obj_t *)0x0) {
            local_464 = 0xffffffff;
            local_460 = 0xffffffff;
            if ((pMan->tName2Suffix == (st__table *)0x0) ||
               (iVar6 = st__lookup(pMan->tName2Suffix,pcVar9,(char **)&local_41c), iVar6 == 0)) {
              Ver_ParseSignalSuffix(pMan,pcVar9,(int *)&local_460,(int *)&local_464);
              if ((local_464 & local_460) == 0xffffffff) {
                iVar6 = strncmp(pcVar9,"Open_",5);
                pAVar11 = local_438;
                if ((iVar6 == 0) ||
                   (iVar6 = strncmp(local_450,"dct_unconnected",0xf), pcVar9 = local_450, iVar6 == 0
                   )) {
                  pAVar12 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NET);
                  Vec_PtrPush((Vec_Ptr_t *)local_440->pName,pAVar12);
                  goto LAB_00356212;
                }
                __s = pMan->sError;
                pcVar15 = Abc_ObjName(pAVar10);
                pcVar20 = "Actual net \"%s\" is missing in box \"%s\".";
                goto LAB_003563b5;
              }
            }
            else {
              local_460 = local_41c >> 8 & 0xff;
              local_464 = local_41c & 0xff;
            }
            iVar7 = local_460 - local_464;
            bVar3 = (int)local_460 < (int)local_464;
            iVar6 = -iVar7;
            if (iVar6 == iVar7 || SBORROW4(iVar6,iVar7) != iVar7 * -2 < 0) {
              iVar6 = iVar7;
            }
            iVar6 = iVar6 + 1;
            uVar22 = local_460;
            do {
              sprintf(local_418,"%s[%d]",local_450,(ulong)uVar22);
              pAVar10 = Ver_ParseFindNet(pNtk_00,local_418);
              pcVar9 = local_450;
              if (pAVar10 == (Abc_Obj_t *)0x0) {
                iVar8 = strncmp(local_450,"Open_",5);
                if ((iVar8 != 0) && (iVar8 = strncmp(pcVar9,"dct_unconnected",0xf), iVar8 != 0))
                goto LAB_003562aa;
                pAVar10 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NET);
              }
              puVar2 = (uint *)local_440->pName;
              uVar21 = puVar2[1];
              if (uVar21 == *puVar2) {
                if ((int)uVar21 < 0x10) {
                  if (*(void **)(puVar2 + 2) == (void *)0x0) {
                    pvVar14 = malloc(0x80);
                  }
                  else {
                    pvVar14 = realloc(*(void **)(puVar2 + 2),0x80);
                  }
                  *(void **)(puVar2 + 2) = pvVar14;
                  *puVar2 = 0x10;
                }
                else {
                  if (*(void **)(puVar2 + 2) == (void *)0x0) {
                    pvVar14 = malloc((ulong)uVar21 << 4);
                  }
                  else {
                    pvVar14 = realloc(*(void **)(puVar2 + 2),(ulong)uVar21 << 4);
                  }
                  *(void **)(puVar2 + 2) = pvVar14;
                  *puVar2 = uVar21 * 2;
                }
              }
              else {
                pvVar14 = *(void **)(puVar2 + 2);
              }
              uVar21 = puVar2[1];
              puVar2[1] = uVar21 + 1;
              *(Abc_Obj_t **)((long)pvVar14 + (long)(int)uVar21 * 8) = pAVar10;
              uVar22 = uVar22 + (uint)(iVar7 == 0 || bVar3) * 2 + -1;
              iVar6 = iVar6 + -1;
              pVVar18 = local_448;
              pAVar10 = local_430;
              pMan = local_428;
              pNtk_00 = local_458;
              pAVar11 = local_438;
            } while (0 < iVar6);
            goto LAB_00356212;
          }
        }
        puVar2 = (uint *)local_440->pName;
        uVar22 = puVar2[1];
        if (uVar22 == *puVar2) {
          if ((int)uVar22 < 0x10) {
            if (*(void **)(puVar2 + 2) == (void *)0x0) {
              pvVar14 = malloc(0x80);
            }
            else {
              pvVar14 = realloc(*(void **)(puVar2 + 2),0x80);
            }
            *(void **)(puVar2 + 2) = pvVar14;
            *puVar2 = 0x10;
          }
          else {
            if (*(void **)(puVar2 + 2) == (void *)0x0) {
              pvVar14 = malloc((ulong)uVar22 << 4);
            }
            else {
              pvVar14 = realloc(*(void **)(puVar2 + 2),(ulong)uVar22 << 4);
            }
            *(void **)(puVar2 + 2) = pvVar14;
            *puVar2 = uVar22 * 2;
          }
        }
        else {
          pvVar14 = *(void **)(puVar2 + 2);
        }
        uVar22 = puVar2[1];
        puVar2[1] = uVar22 + 1;
        *(Abc_Obj_t **)((long)pvVar14 + (long)(int)uVar22 * 8) = pAVar11;
        pVVar18 = local_448;
        pAVar11 = local_438;
      }
LAB_00356212:
      if (cVar4 == '.') {
        Ver_ParseSkipComments(pMan);
        cVar4 = Ver_StreamPopChar(pVVar18);
        if (cVar4 != ')') {
          __s = pMan->sError;
          pcVar15 = Abc_ObjName(pAVar10);
          pcVar20 = "Cannot parse formal parameter %s of box %s (expected closing parenthesis).";
          pcVar9 = local_450;
          goto LAB_003563b5;
        }
        Ver_ParseSkipComments(pMan);
      }
      cVar4 = Ver_StreamPopChar(pVVar18);
      if (cVar4 != ',') goto LAB_003562f7;
      Ver_ParseSkipComments(pMan);
    } while( true );
  }
  pcVar20 = pMan->sError;
  pcVar9 = Abc_ObjName(pAVar10);
  pcVar15 = "Cannot parse box %s (expected opening parenthesis).";
LAB_00356271:
  sprintf(pcVar20,pcVar15,pcVar9);
LAB_003562dd:
  Ver_ParsePrintErrorMessage(pMan);
  return 0;
LAB_003562aa:
  pMan = local_428;
  pcVar15 = Abc_ObjName(local_430);
  pcVar20 = "Actual net \"%s\" is missing in box \"%s\".";
LAB_003562d0:
  sprintf(pMan->sError,pcVar20,pcVar9,pcVar15);
  goto LAB_003562dd;
LAB_003562f7:
  if (cVar4 != ')') {
    __s = pMan->sError;
    pcVar15 = Abc_ObjName(pAVar10);
    pcVar20 = "Cannot parse formal parameter %s of box %s (expected comma).";
    pcVar9 = local_450;
LAB_003563b5:
    sprintf(__s,pcVar20,pcVar9,pcVar15);
    goto LAB_003562dd;
  }
  Ver_ParseSkipComments(pMan);
  cVar4 = Ver_StreamPopChar(pVVar18);
  if (cVar4 == ';') {
    return 1;
  }
  pcVar9 = Abc_ObjName(pAVar10);
  pcVar15 = "Cannot read box %s (expected closing semicolumn).";
LAB_0035636f:
  pcVar20 = pMan->sError;
  goto LAB_00356271;
}

Assistant:

int Ver_ParseBox( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkBox )
{
    char Buffer[1000];
    Ver_Stream_t * p = pMan->pReader;
    Ver_Bundle_t * pBundle;
    Vec_Ptr_t * vBundles;
    Abc_Obj_t * pNetActual; 
    Abc_Obj_t * pNode;
    char * pWord, Symbol;
    int fCompl, fFormalIsGiven;
    int i, k, Bit, Limit, nMsb, nLsb, fQuit, flag;

    // gate the name of the box
    pWord = Ver_ParseGetName( pMan );
    if ( pWord == NULL )
        return 0;

    // create a box with this name
    pNode = Abc_NtkCreateBlackbox( pNtk );
    pNode->pData = pNtkBox;
    Abc_ObjAssignName( pNode, pWord, NULL );

    // continue parsing the box
    if ( Ver_StreamPopChar(p) != '(' )
    {
        sprintf( pMan->sError, "Cannot parse box %s (expected opening parenthesis).", Abc_ObjName(pNode) );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    Ver_ParseSkipComments( pMan );
 
    // parse pairs of formal/actual inputs
    vBundles = Vec_PtrAlloc( 16 );
    pNode->pCopy = (Abc_Obj_t *)vBundles;
    while ( 1 )
    {
        // allocate the bundle (formal name + array of actual nets)
        pBundle = ABC_ALLOC( Ver_Bundle_t, 1 );
        pBundle->pNameFormal = NULL;
        pBundle->vNetsActual = Vec_PtrAlloc( 4 );
        Vec_PtrPush( vBundles, pBundle );

        // process one pair of formal/actual parameters
        fFormalIsGiven = 0;
        if ( Ver_StreamScanChar(p) == '.' )
        {
            fFormalIsGiven = 1;
            if ( Ver_StreamPopChar(p) != '.' )
            {
                sprintf( pMan->sError, "Cannot parse box %s (expected .).", Abc_ObjName(pNode) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }

            // parse the formal name
            pWord = Ver_ParseGetName( pMan );
            if ( pWord == NULL )
                return 0;

            // save the name
            pBundle->pNameFormal = Extra_UtilStrsav( pWord );

            // open the parenthesis
            if ( Ver_StreamPopChar(p) != '(' )
            {
                sprintf( pMan->sError, "Cannot formal parameter %s of box %s (expected opening parenthesis).", pWord, Abc_ObjName(pNode));
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            Ver_ParseSkipComments( pMan );
        }

        // check if this is the beginning of {} expression
        Symbol = Ver_StreamScanChar(p);

        // consider the case of vector-inputs
        if ( Symbol == '{' )
        {
            // skip this char
            Ver_StreamPopChar(p);

            // read actual names
            i = 0;
            fQuit = 0;
            while ( 1 )
            {
                // parse the formal name
                Ver_ParseSkipComments( pMan );
                pWord = Ver_ParseGetName( pMan );
                if ( pWord == NULL )
                    return 0;

                // check if the last char is a closing brace
                if ( pWord[strlen(pWord)-1] == '}' )
                {
                    pWord[strlen(pWord)-1] = 0;
                    fQuit = 1;
                }
                if ( pWord[0] == 0 )
                    break;

                // check for constant
                if ( pWord[0] >= '1' && pWord[0] <= '9' )
                {
                    if ( !Ver_ParseConstant( pMan, pWord ) )
                        return 0;
                    // add constant MSB to LSB
                    for ( k = 0; k < Vec_PtrSize(pMan->vNames); k++, i++ )
                    {
                        // get the actual net
                        sprintf( Buffer, "1\'b%d", (int)(Vec_PtrEntry(pMan->vNames,k) != NULL) );
                        pNetActual = Ver_ParseFindNet( pNtk, Buffer );
                        if ( pNetActual == NULL )
                        {
                            sprintf( pMan->sError, "Actual net \"%s\" is missing in gate \"%s\".", Buffer, Abc_ObjName(pNode) );
                            Ver_ParsePrintErrorMessage( pMan );
                            return 0;
                        }
                        Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                    }
                }
                else
                {
                    // get the suffix of the form [m:n]
                    if ( pWord[strlen(pWord)-1] == ']' && !pMan->fNameLast )
                        Ver_ParseSignalSuffix( pMan, pWord, &nMsb, &nLsb );
                    else
                        Ver_ParseLookupSuffix( pMan, pWord, &nMsb, &nLsb );

                    // generate signals
                    if ( nMsb == -1 && nLsb == -1 )
                    {
                        // get the actual net
                        pNetActual = Ver_ParseFindNet( pNtk, pWord );
                        if ( pNetActual == NULL )
                        {
                            if ( !strncmp(pWord, "Open_", 5) ||
                                !strncmp(pWord, "dct_unconnected", 15) ) 
                                pNetActual = Abc_NtkCreateNet( pNtk );
                            else
                            {
                                sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                Ver_ParsePrintErrorMessage( pMan );
                                return 0;
                            }
                        }
                        Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                        i++;
                    }
                    else
                    {
                        // go from MSB to LSB
                        assert( nMsb >= 0 && nLsb >= 0 );
                        Limit = (nMsb > nLsb) ? nMsb - nLsb + 1: nLsb - nMsb + 1;  
                        for ( Bit = nMsb, k = Limit - 1; k >= 0; Bit = (nMsb > nLsb ? Bit - 1: Bit + 1), k--, i++ )
                        {
                            // get the actual net
                            sprintf( Buffer, "%s[%d]", pWord, Bit );
                            pNetActual = Ver_ParseFindNet( pNtk, Buffer );
                            if ( pNetActual == NULL )
                            {
                                if ( !strncmp(pWord, "Open_", 5) ||
                                    !strncmp(pWord, "dct_unconnected", 15) ) 
                                    pNetActual = Abc_NtkCreateNet( pNtk );
                                else
                                {
                                    sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                    Ver_ParsePrintErrorMessage( pMan );
                                    return 0;
                                }
                            }
                            Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                        }
                    }
                }

                if ( fQuit )
                    break;

                // skip comma
                Ver_ParseSkipComments( pMan );
                Symbol = Ver_StreamPopChar(p);
                if ( Symbol == '}' )
                    break;
                if ( Symbol != ',' )
                {
                    sprintf( pMan->sError, "Cannot parse formal parameter %s of gate %s (expected comma).", pWord, Abc_ObjName(pNode) );
                    Ver_ParsePrintErrorMessage( pMan );
                    return 0;
                }
            }
        }
        else
        {
            // get the next word
            pWord = Ver_ParseGetName( pMan );
            if ( pWord == NULL )
                return 0;
            // consider the case of empty name
            fCompl = 0;
            if ( pWord[0] == 0 )
            {
                pNetActual = Abc_NtkCreateNet( pNtk );
                Vec_PtrPush( pBundle->vNetsActual, Abc_ObjNotCond( pNetActual, fCompl ) );
            }
            else
            {
                // get the actual net
                flag=0;
                pNetActual = Ver_ParseFindNet( pNtk, pWord );
                if ( pNetActual == NULL ) 
                {
                    Ver_ParseLookupSuffix( pMan, pWord, &nMsb, &nLsb );
                    if ( nMsb == -1 && nLsb == -1 ) 
                    {
                        Ver_ParseSignalSuffix( pMan, pWord, &nMsb, &nLsb );
                        if ( nMsb == -1 && nLsb == -1 ) 
                        {
                            if ( !strncmp(pWord, "Open_", 5) ||
                                !strncmp(pWord, "dct_unconnected", 15) ) 
                            {
                                pNetActual = Abc_NtkCreateNet( pNtk );
                                Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                            } 
                            else 
                            {
                                sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                Ver_ParsePrintErrorMessage( pMan );
                                return 0;
                            }
                        } 
                        else 
                        {
                            flag=1;
                        }
                    } 
                    else 
                    {
                        flag=1;
                    }
                    if (flag) 
                    {
                        Limit = (nMsb > nLsb) ? nMsb - nLsb + 1: nLsb - nMsb + 1;  
                        for ( Bit = nMsb, k = Limit - 1; k >= 0; Bit = (nMsb > nLsb ? Bit - 1: Bit + 1), k--)
                        {
                            // get the actual net
                            sprintf( Buffer, "%s[%d]", pWord, Bit );
                            pNetActual = Ver_ParseFindNet( pNtk, Buffer );
                            if ( pNetActual == NULL )
                            {
                                if ( !strncmp(pWord, "Open_", 5) ||
                                    !strncmp(pWord, "dct_unconnected", 15)) 
                                    pNetActual = Abc_NtkCreateNet( pNtk );
                                else
                                {
                                    sprintf( pMan->sError, "Actual net \"%s\" is missing in box \"%s\".", pWord, Abc_ObjName(pNode) );
                                    Ver_ParsePrintErrorMessage( pMan );
                                    return 0;
                                }
                            }
                            Vec_PtrPush( pBundle->vNetsActual, pNetActual );
                        }
                    }
                } 
                else 
                {
                    Vec_PtrPush( pBundle->vNetsActual, Abc_ObjNotCond( pNetActual, fCompl ) );
                }
            }
        }

        if ( fFormalIsGiven )
        {
            // close the parenthesis
            Ver_ParseSkipComments( pMan );
            if ( Ver_StreamPopChar(p) != ')' )
            {
                sprintf( pMan->sError, "Cannot parse formal parameter %s of box %s (expected closing parenthesis).", pWord, Abc_ObjName(pNode) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            Ver_ParseSkipComments( pMan );
        }

        // check if it is the end of gate
        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ')' )
            break;
        // skip comma
        if ( Symbol != ',' )
        {
            sprintf( pMan->sError, "Cannot parse formal parameter %s of box %s (expected comma).", pWord, Abc_ObjName(pNode) );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        Ver_ParseSkipComments( pMan );
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    if ( Ver_StreamPopChar(p) != ';' )
    {
        sprintf( pMan->sError, "Cannot read box %s (expected closing semicolumn).", Abc_ObjName(pNode) );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    return 1;
}